

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook_state.cpp
# Opt level: O3

bool __thiscall
HookStateStop::Start(HookStateStop *this,shared_ptr<Debugger> *debugger,lua_State *current)

{
  Debugger *this_00;
  EmmyDebuggerManager *pEVar1;
  shared_ptr<HookState> local_20;
  
  if (current != (lua_State *)0x0) {
    this_00 = (debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pEVar1 = Debugger::GetEmmyDebuggerManager(this_00);
    local_20.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &((pEVar1->stateContinue).super___shared_ptr<HookStateContinue,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->super_HookState;
    local_20.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (pEVar1->stateContinue).super___shared_ptr<HookStateContinue,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_20.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_20.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_20.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_20.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_20.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    Debugger::SetHookState(this_00,&local_20);
    if (local_20.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_20.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  return current != (lua_State *)0x0;
}

Assistant:

bool HookStateStop::Start(std::shared_ptr<Debugger> debugger, lua_State* current)
{
	if (current == nullptr)
		return false;

	// 不能取消当前hook
	// 当unity 停止play之后附加调试依然运行，此时lua虚拟机可能已经销毁
	// 所以以下操作会导致进程崩溃
	// debugger->UpdateHook(0, current);
	
	// 此处会引发递归加锁而报错，而如果使用递归锁对调试体验影响
	// debugger->DoAction(DebugAction::Continue);
	debugger->SetHookState(debugger->GetEmmyDebuggerManager()->stateContinue);

	return true;
}